

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGhsMultiGenerator::WriteCustomRuleBOD(cmGlobalGhsMultiGenerator *this,ostream *fout)

{
  std::__ostream_insert<char,std::char_traits<char>>
            (fout,
             "Commands {\n  Custom_Rule_Command {\n    name = \"Custom Rule Command\"\n    exec = \""
             ,0x50);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"/bin/sh",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (fout,"\"\n    options = {\"SpecialOptions\"}\n  }\n}\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"\n\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (fout,
             "FileTypes {\n  CmakeRule {\n    name = \"Custom Rule\"\n    action = \"&Run\"\n    extensions = {\""
             ,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"sh",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (fout,
             "\"}\n    grepable = false\n    command = \"Custom Rule Command\"\n    commandLine = \"$COMMAND "
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            (fout,
             " $INPUTFILE\"\n    progress = \"Processing Custom Rule\"\n    promoteToFirstPass = true\n    outputType = \"None\"\n    color = \"#800080\"\n  }\n}\n"
             ,0x87);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteCustomRuleBOD(std::ostream& fout)
{
  fout << "Commands {\n"
          "  Custom_Rule_Command {\n"
          "    name = \"Custom Rule Command\"\n"
          "    exec = \"";
#ifdef _WIN32
  fout << "cmd.exe";
#else
  fout << "/bin/sh";
#endif
  fout << "\"\n"
          "    options = {\"SpecialOptions\"}\n"
          "  }\n"
          "}\n";

  fout << "\n\n";
  fout << "FileTypes {\n"
          "  CmakeRule {\n"
          "    name = \"Custom Rule\"\n"
          "    action = \"&Run\"\n"
          "    extensions = {\"";
#ifdef _WIN32
  fout << "bat";
#else
  fout << "sh";
#endif
  fout << "\"}\n"
          "    grepable = false\n"
          "    command = \"Custom Rule Command\"\n"
          "    commandLine = \"$COMMAND ";
#ifdef _WIN32
  fout << "/c";
#endif
  fout << " $INPUTFILE\"\n"
          "    progress = \"Processing Custom Rule\"\n"
          "    promoteToFirstPass = true\n"
          "    outputType = \"None\"\n"
          "    color = \"#800080\"\n"
          "  }\n"
          "}\n";
}